

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::strTree<char,kj::String,char>
          (StringTree *__return_storage_ptr__,kj *this,char *params,String *params_1,char *params_2)

{
  FixedArray<char,_1UL> *pFVar1;
  long lVar2;
  undefined8 uVar3;
  undefined1 local_42;
  undefined1 local_41;
  long local_40;
  FixedArray<char,_1UL> *local_38;
  long lStack_30;
  undefined8 *local_28;
  long local_20;
  undefined8 uStack_18;
  undefined8 *local_10;
  
  local_41 = *this;
  lStack_30 = *(long *)(params + 8);
  local_40 = 0;
  if (lStack_30 != 0) {
    local_40 = lStack_30 + -1;
  }
  local_38 = *(FixedArray<char,_1UL> **)params;
  local_28 = *(undefined8 **)(params + 0x10);
  params[0] = '\0';
  params[1] = '\0';
  params[2] = '\0';
  params[3] = '\0';
  params[4] = '\0';
  params[5] = '\0';
  params[6] = '\0';
  params[7] = '\0';
  params[8] = '\0';
  params[9] = '\0';
  params[10] = '\0';
  params[0xb] = '\0';
  params[0xc] = '\0';
  params[0xd] = '\0';
  params[0xe] = '\0';
  params[0xf] = '\0';
  local_20 = 0;
  uStack_18 = 0;
  local_10 = (undefined8 *)0x0;
  local_42 = *(undefined1 *)&(params_1->content).ptr;
  StringTree::concat<kj::FixedArray<char,1ul>,kj::StringTree,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,(StringTree *)&local_41,(FixedArray<char,_1UL> *)&local_40,
             (StringTree *)&local_42,local_38);
  uVar3 = uStack_18;
  lVar2 = local_20;
  if (local_20 != 0) {
    local_20 = 0;
    uStack_18 = 0;
    (**(code **)*local_10)
              (local_10,lVar2,0x40,uVar3,uVar3,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  lVar2 = lStack_30;
  pFVar1 = local_38;
  if (local_38 != (FixedArray<char,_1UL> *)0x0) {
    local_38 = (FixedArray<char,_1UL> *)0x0;
    lStack_30 = 0;
    (**(code **)*local_28)(local_28,pFVar1,1,lVar2,lVar2,0);
  }
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}